

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Induction.cpp
# Opt level: O1

void __thiscall
Inferences::InductionClauseIterator::processClause(InductionClauseIterator *this,Clause *premise)

{
  bool bVar1;
  ulong uVar2;
  
  bVar1 = InductionHelper::isInductionClause(premise);
  if ((bVar1) && ((*(uint *)&premise->field_0x38 & 0xfffff) != 0)) {
    uVar2 = 0;
    do {
      processLiteral(this,premise,premise->_literals[uVar2]);
      uVar2 = uVar2 + 1;
    } while (uVar2 < ((uint)*(undefined8 *)&premise->field_0x38 & 0xfffff));
  }
  bVar1 = InductionHelper::isIntInductionOneOn();
  if (bVar1) {
    bVar1 = InductionHelper::isIntegerComparison(premise);
    if (bVar1) {
      processIntegerComparison(this,premise,premise->_literals[0]);
      return;
    }
  }
  return;
}

Assistant:

void InductionClauseIterator::processClause(Clause* premise)
{
  // The premise should either contain a literal on which we want to apply induction,
  // or it should be an integer constant comparison we use as a bound.
  if (InductionHelper::isInductionClause(premise)) {
    for (unsigned i=0;i<premise->length();i++) {
      processLiteral(premise,(*premise)[i]);
    }
  }
  if (InductionHelper::isIntInductionOneOn() && InductionHelper::isIntegerComparison(premise)) {
    processIntegerComparison(premise, (*premise)[0]);
  }
}